

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O3

NFSubstitution * __thiscall
icu_63::NFRule::extractSubstitution
          (NFRule *this,NFRuleSet *ruleSet,NFRule *predecessor,UErrorCode *status)

{
  UnicodeString *this_00;
  short sVar1;
  uint srcStart;
  uint uVar2;
  NFSubstitution *pNVar3;
  char16_t *pcVar4;
  uint uVar5;
  UChar c;
  uint uVar6;
  int srcLength;
  UnicodeString subToken;
  UnicodeString local_70;
  
  srcStart = indexOfAnyRulePrefix(this);
  if (srcStart == 0xffffffff) {
LAB_002666f6:
    pNVar3 = (NFSubstitution *)0x0;
  }
  else {
    this_00 = &this->fRuleText;
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar2 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      uVar2 = (int)sVar1 >> 5;
    }
    uVar6 = (int)uVar2 >> 0x1f & uVar2;
    uVar2 = UnicodeString::indexOf(this_00,L">>>",0,3,uVar6,uVar2 - uVar6);
    if (uVar2 == srcStart) {
      uVar2 = srcStart + 2;
LAB_002666bc:
      if (uVar2 == 0xffffffff) goto LAB_002666f6;
    }
    else {
      sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar2 = (this->fRuleText).fUnion.fFields.fLength;
      }
      else {
        uVar2 = (int)sVar1 >> 5;
      }
      c = L'\xffff';
      if (srcStart < uVar2) {
        if (((int)sVar1 & 2U) == 0) {
          pcVar4 = (this->fRuleText).fUnion.fFields.fArray;
        }
        else {
          pcVar4 = (char16_t *)((long)&(this->fRuleText).fUnion + 2);
        }
        c = pcVar4[(int)srcStart];
      }
      uVar6 = srcStart + 1;
      if ((int)uVar2 < (int)(srcStart + 1)) {
        uVar6 = uVar2;
      }
      uVar5 = 0;
      if (-2 < (int)srcStart) {
        uVar5 = uVar6;
      }
      uVar2 = UnicodeString::doIndexOf(this_00,c,uVar5,uVar2 - uVar5);
      if ((c != L'<') || (uVar2 == 0xffffffff)) goto LAB_002666bc;
      sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar6 = (this->fRuleText).fUnion.fFields.fLength;
      }
      else {
        uVar6 = (int)sVar1 >> 5;
      }
      if ((int)uVar2 < (int)(uVar6 - 1)) {
        uVar5 = uVar2 + 1;
        if (uVar5 < uVar6) {
          if (((int)sVar1 & 2U) == 0) {
            pcVar4 = (this->fRuleText).fUnion.fFields.fArray;
          }
          else {
            pcVar4 = (char16_t *)((long)&(this->fRuleText).fUnion + 2);
          }
          if (pcVar4[(int)uVar5] == L'<') {
            uVar2 = uVar5;
          }
        }
        goto LAB_002666bc;
      }
    }
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003febe0;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    UnicodeString::unBogus(&local_70);
    srcLength = (uVar2 - srcStart) + 1;
    if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
      local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doReplace(&local_70,0,local_70.fUnion.fFields.fLength,this_00,srcStart,srcLength)
    ;
    pNVar3 = NFSubstitution::makeSubstitution
                       (srcStart,this,predecessor,ruleSet,this->formatter,&local_70,status);
    UnicodeString::doReplace(this_00,srcStart,srcLength,(UChar *)0x0,0,0);
    UnicodeString::~UnicodeString(&local_70);
  }
  return pNVar3;
}

Assistant:

NFSubstitution *
NFRule::extractSubstitution(const NFRuleSet* ruleSet,
                            const NFRule* predecessor,
                            UErrorCode& status)
{
    NFSubstitution* result = NULL;

    // search the rule's rule text for the first two characters of
    // a substitution token
    int32_t subStart = indexOfAnyRulePrefix();
    int32_t subEnd = subStart;

    // if we didn't find one, create a null substitution positioned
    // at the end of the rule text
    if (subStart == -1) {
        return NULL;
    }

    // special-case the ">>>" token, since searching for the > at the
    // end will actually find the > in the middle
    if (fRuleText.indexOf(gGreaterGreaterGreater, 3, 0) == subStart) {
        subEnd = subStart + 2;

        // otherwise the substitution token ends with the same character
        // it began with
    } else {
        UChar c = fRuleText.charAt(subStart);
        subEnd = fRuleText.indexOf(c, subStart + 1);
        // special case for '<%foo<<'
        if (c == gLessThan && subEnd != -1 && subEnd < fRuleText.length() - 1 && fRuleText.charAt(subEnd+1) == c) {
            // ordinals use "=#,##0==%abbrev=" as their rule.  Notice that the '==' in the middle
            // occurs because of the juxtaposition of two different rules.  The check for '<' is a hack
            // to get around this.  Having the duplicate at the front would cause problems with
            // rules like "<<%" to format, say, percents...
            ++subEnd;
        }
   }

    // if we don't find the end of the token (i.e., if we're on a single,
    // unmatched token character), create a null substitution positioned
    // at the end of the rule
    if (subEnd == -1) {
        return NULL;
    }

    // if we get here, we have a real substitution token (or at least
    // some text bounded by substitution token characters).  Use
    // makeSubstitution() to create the right kind of substitution
    UnicodeString subToken;
    subToken.setTo(fRuleText, subStart, subEnd + 1 - subStart);
    result = NFSubstitution::makeSubstitution(subStart, this, predecessor, ruleSet,
        this->formatter, subToken, status);

    // remove the substitution from the rule text
    fRuleText.removeBetween(subStart, subEnd+1);

    return result;
}